

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easygetopt.c
# Opt level: O0

curl_easyoption * lookup(char *name,CURLoption id)

{
  int iVar1;
  curl_easyoption *local_28;
  curl_easyoption *o;
  CURLoption id_local;
  char *name_local;
  
  if ((name != (char *)0x0) || (id != 0)) {
    local_28 = Curl_easyopts;
    do {
      if (name == (char *)0x0) {
        if ((local_28->id == id) && ((local_28->flags & 1) == 0)) {
          return local_28;
        }
      }
      else {
        iVar1 = curl_strequal(local_28->name,name);
        if (iVar1 != 0) {
          return local_28;
        }
      }
      local_28 = local_28 + 1;
    } while (local_28->name != (char *)0x0);
  }
  return (curl_easyoption *)0x0;
}

Assistant:

static struct curl_easyoption *lookup(const char *name, CURLoption id)
{
  DEBUGASSERT(name || id);
  DEBUGASSERT(!Curl_easyopts_check());
  if(name || id) {
    struct curl_easyoption *o = &Curl_easyopts[0];
    do {
      if(name) {
        if(strcasecompare(o->name, name))
          return o;
      }
      else {
        if((o->id == id) && !(o->flags & CURLOT_FLAG_ALIAS))
          /* do not match alias options */
          return o;
      }
      o++;
    } while(o->name);
  }
  return NULL;
}